

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

int __thiscall iDynTree::BerdyHelper::init(BerdyHelper *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  BerdyOptions *this_00;
  undefined8 uVar2;
  BerdyOptions *in_RCX;
  BerdyOptions *in_RDX;
  Model modelCopy;
  Model local_150 [312];
  BerdyOptions *local_18;
  EVP_PKEY_CTX *local_10;
  BerdyHelper *local_8;
  
  local_18 = in_RDX;
  local_10 = ctx;
  local_8 = this;
  iDynTree::Model::Model(local_150,(Model *)ctx);
  this_00 = (BerdyOptions *)iDynTree::Model::sensors();
  iDynTree::SensorsList::operator=((SensorsList *)this_00,(SensorsList *)local_18);
  BerdyOptions::BerdyOptions(this_00,local_18);
  iVar1 = init(this,(EVP_PKEY_CTX *)local_150);
  BerdyOptions::~BerdyOptions(in_RCX);
  uVar2 = iDynTree::Model::~Model(local_150);
  return (uint)CONCAT71((int7)((ulong)uVar2 >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool BerdyHelper::init(const Model& model,
                       const SensorsList& sensors,
                       const BerdyOptions options)
{
    Model modelCopy = model;
    modelCopy.sensors() = sensors;
    return init(modelCopy, options);
}